

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O0

void * mi_heap_malloc_zero_aligned_at_overalloc
                 (mi_heap_t *heap,size_t size,size_t alignment,size_t offset,_Bool zero)

{
  mi_page_t *page_00;
  ulong uVar1;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  byte in_R8B;
  void *aligned_p;
  uintptr_t adjust;
  uintptr_t poffset;
  uintptr_t align_mask;
  mi_page_t *page;
  size_t oversize;
  void *p;
  size_t in_stack_ffffffffffffff78;
  mi_block_t *n;
  mi_heap_t *in_stack_ffffffffffffff80;
  void *pvVar2;
  void *dst;
  undefined8 in_stack_ffffffffffffff88;
  size_t size_00;
  mi_heap_t *in_stack_ffffffffffffff98;
  mi_block_t *local_38;
  mi_block_t *local_8;
  
  if (in_RDX < 0x1000001) {
    local_38 = (mi_block_t *)
               mi_heap_malloc_zero_no_guarded
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,false);
    if (local_38 == (mi_block_t *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    if (in_RCX != 0) {
      return (void *)0x0;
    }
    size_00 = in_RSI;
    if (in_RSI < 0x401) {
      size_00 = 0x401;
    }
    local_38 = (mi_block_t *)
               _mi_heap_malloc_zero_ex
                         (in_stack_ffffffffffffff98,size_00,
                          SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0),
                          (size_t)in_stack_ffffffffffffff80);
    if (local_38 == (mi_block_t *)0x0) {
      return (void *)0x0;
    }
  }
  page_00 = _mi_ptr_page((void *)0xc4ef94);
  uVar1 = (long)&local_38->next + in_RCX & in_RDX - 1;
  if (uVar1 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(in_RDX - uVar1);
  }
  n = (mi_block_t *)((long)&local_38->next + (long)pvVar2);
  dst = pvVar2;
  if (n != local_38) {
    mi_page_set_has_aligned(page_00,true);
    _mi_padding_shrink(page_00,local_38,(long)pvVar2 + in_RSI);
  }
  local_8 = n;
  if ((0x1000000 < in_RDX) && ((in_R8B & 1) != 0)) {
    mi_usable_size((void *)0xc4f04d);
    _mi_memzero_aligned(dst,(size_t)n);
  }
  return local_8;
}

Assistant:

static mi_decl_noinline void* mi_heap_malloc_zero_aligned_at_overalloc(mi_heap_t* const heap, const size_t size, const size_t alignment, const size_t offset, const bool zero) mi_attr_noexcept
{
  mi_assert_internal(size <= (MI_MAX_ALLOC_SIZE - MI_PADDING_SIZE));
  mi_assert_internal(alignment != 0 && _mi_is_power_of_two(alignment));

  void* p;
  size_t oversize;
  if mi_unlikely(alignment > MI_BLOCK_ALIGNMENT_MAX) {
    // use OS allocation for very large alignment and allocate inside a huge page (dedicated segment with 1 page)
    // This can support alignments >= MI_SEGMENT_SIZE by ensuring the object can be aligned at a point in the
    // first (and single) page such that the segment info is `MI_SEGMENT_SIZE` bytes before it (so it can be found by aligning the pointer down)
    if mi_unlikely(offset != 0) {
      // todo: cannot support offset alignment for very large alignments yet
#if MI_DEBUG > 0
      _mi_error_message(EOVERFLOW, "aligned allocation with a very large alignment cannot be used with an alignment offset (size %zu, alignment %zu, offset %zu)\n", size, alignment, offset);
#endif
      return NULL;
    }
    oversize = (size <= MI_SMALL_SIZE_MAX ? MI_SMALL_SIZE_MAX + 1 /* ensure we use generic malloc path */ : size);
    // note: no guarded as alignment > 0
    p = _mi_heap_malloc_zero_ex(heap, oversize, false, alignment); // the page block size should be large enough to align in the single huge page block
    // zero afterwards as only the area from the aligned_p may be committed!
    if (p == NULL) return NULL;
  }
  else {
    // otherwise over-allocate
    oversize = (size < MI_MAX_ALIGN_SIZE ? MI_MAX_ALIGN_SIZE : size) + alignment - 1;  // adjust for size <= 16; with size 0 and aligment 64k, we would allocate a 64k block and pointing just beyond that.
    p = mi_heap_malloc_zero_no_guarded(heap, oversize, zero);
    if (p == NULL) return NULL;
  }